

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

int Sbl_ManCreateCnf(Sbl_Man_t *p)

{
  int iVar1;
  sat_solver *psVar2;
  Vec_Int_t *p_00;
  lit *begin;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  word wVar11;
  word wVar12;
  int iVar13;
  int iVar14;
  int pLits [2];
  int local_58;
  int local_54;
  ulong local_50;
  int local_48;
  int local_44;
  word *local_40;
  word *local_38;
  
  local_38 = p->vCutsN1->pArray;
  local_40 = p->vCutsN2->pArray;
  iVar6 = p->FirstVar;
  iVar5 = sat_solver_nvars(p->pSat);
  if (iVar6 != iVar5) {
    __assert_fail("p->FirstVar == sat_solver_nvars(p->pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x356,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
  }
  psVar2 = p->pSat;
  iVar6 = sat_solver_nvars(psVar2);
  sat_solver_setnvars(psVar2,iVar6 + p->vCutsI1->nSize);
  if (0 < p->vAnds->nSize) {
    uVar10 = 0;
    do {
      uVar7 = p->vLeaves->nSize + (int)uVar10;
      if (((int)uVar7 < 0) || (p->vCutsStart->nSize <= (int)uVar7)) {
LAB_007a61cf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      local_50 = uVar10;
      if (p->vCutsNum->nSize <= (int)uVar7) goto LAB_007a61cf;
      iVar5 = p->vCutsStart->pArray[uVar7];
      iVar1 = p->vCutsNum->pArray[uVar7];
      iVar6 = iVar5 + -1 + iVar1;
      p_00 = p->vLits;
      p_00->nSize = 0;
      Vec_IntPush(p_00,(int)uVar10 * 2 + 1);
      if (iVar5 < iVar6) {
        iVar13 = iVar1 + -1;
        iVar14 = iVar5;
        do {
          iVar9 = p->FirstVar + iVar14;
          if (iVar9 < 0) goto LAB_007a6191;
          Vec_IntPush(p->vLits,iVar9 * 2);
          iVar14 = iVar14 + 1;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      begin = p->vLits->pArray;
      iVar13 = sat_solver_addclause(p->pSat,begin,begin + p->vLits->nSize);
      if (iVar13 == 0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x368,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
      }
      if (iVar5 < iVar6) {
        lVar8 = (long)iVar5;
        local_44 = (int)local_50 * 2;
        local_48 = iVar5 + iVar1 + -1;
        do {
          iVar6 = p->FirstVar + (int)lVar8;
          if (iVar6 < 0) {
LAB_007a6191:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          wVar11 = local_40[lVar8];
          wVar12 = local_38[lVar8];
          local_58 = iVar6 * 2 + 1;
          local_54 = local_44;
          iVar6 = sat_solver_addclause(p->pSat,&local_58,(lit *)&local_50);
          if (iVar6 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x373,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
          }
          if (wVar12 != 0) {
            iVar6 = 0;
            uVar7 = 0;
            do {
              if ((wVar12 & 1) != 0) {
                local_54 = iVar6;
                iVar5 = sat_solver_addclause(p->pSat,&local_58,(lit *)&local_50);
                if (iVar5 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                ,0x37c,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
                }
              }
              if (0x3e < uVar7) break;
              uVar7 = uVar7 + 1;
              iVar6 = iVar6 + 2;
              bVar4 = 1 < wVar12;
              wVar12 = wVar12 >> 1;
            } while (bVar4);
          }
          if (wVar11 != 0) {
            uVar7 = 0;
            iVar6 = 0x80;
            do {
              if ((wVar11 & 1) != 0) {
                local_54 = iVar6;
                iVar5 = sat_solver_addclause(p->pSat,&local_58,(lit *)&local_50);
                if (iVar5 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                ,0x385,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
                }
              }
              if (0x3e < uVar7) break;
              uVar7 = uVar7 + 1;
              iVar6 = iVar6 + 2;
              bVar4 = 1 < wVar11;
              wVar11 = wVar11 >> 1;
            } while (bVar4);
          }
          lVar8 = lVar8 + 1;
        } while (local_48 != (int)lVar8);
      }
      uVar7 = (int)local_50 + 1;
      uVar10 = (ulong)uVar7;
    } while ((int)uVar7 < p->vAnds->nSize);
  }
  psVar2 = p->pSat;
  piVar3 = p->vPolar->pArray;
  uVar7 = p->vPolar->nSize;
  if (0 < psVar2->size) {
    lVar8 = 0;
    do {
      psVar2->polarity[lVar8] = '\0';
      lVar8 = lVar8 + 1;
    } while (lVar8 < psVar2->size);
  }
  if (0 < (int)uVar7) {
    uVar10 = 0;
    do {
      psVar2->polarity[piVar3[uVar10]] = '\x01';
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  return 1;
}

Assistant:

int Sbl_ManCreateCnf( Sbl_Man_t * p )
{
    int i, k, c, pLits[2], value;
    word * pCutsN1 = Vec_WrdArray(p->vCutsN1);
    word * pCutsN2 = Vec_WrdArray(p->vCutsN2);
    assert( p->FirstVar == sat_solver_nvars(p->pSat) );
    sat_solver_setnvars( p->pSat, sat_solver_nvars(p->pSat) + Vec_WrdSize(p->vCutsI1) );
    //printf( "\n" );
    for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
    {
        int Start0 = Vec_IntEntry( p->vCutsStart, Vec_IntSize(p->vLeaves) + i );
        int Limit0 = Start0 + Vec_IntEntry( p->vCutsNum, Vec_IntSize(p->vLeaves) + i ) - 1;
        // add main clause
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_Var2Lit(i, 1) );
        //printf( "Node %d implies cuts: ", i );
        for ( k = Start0; k < Limit0; k++ )
        {
            Vec_IntPush( p->vLits, Abc_Var2Lit(p->FirstVar+k, 0) );
            //printf( "%d ", p->FirstVar+k );
        }
        //printf( "\n" );
        value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntLimit(p->vLits)  );
        assert( value );
        // binary clauses
        for ( k = Start0; k < Limit0; k++ )
        {
            word Cut1 = pCutsN1[k];
            word Cut2 = pCutsN2[k];
            //printf( "Cut %d implies root node %d.\n", p->FirstVar+k, i );
            // root clause
            pLits[0] = Abc_Var2Lit( p->FirstVar+k, 1 );
            pLits[1] = Abc_Var2Lit( i, 0 );
            value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
            assert( value );
            // fanin clauses
            for ( c = 0; c < 64 && Cut1; c++, Cut1 >>= 1 )
            {
                if ( (Cut1 & 1) == 0 )
                    continue;
                //printf( "Cut %d implies fanin %d.\n", p->FirstVar+k, c );
                pLits[1] = Abc_Var2Lit( c, 0 );
                value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
                assert( value );
            }
            for ( c = 0; c < 64 && Cut2; c++, Cut2 >>= 1 )
            {
                if ( (Cut2 & 1) == 0 )
                    continue;
                //printf( "Cut %d implies fanin %d.\n", p->FirstVar+k, c );
                pLits[1] = Abc_Var2Lit( c+64, 0 );
                value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
                assert( value );
            }
        }
    }
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolar), Vec_IntSize(p->vPolar) );
    return 1;
}